

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  ushort *puVar1;
  u32 uVar2;
  u8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  ushort uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ushort uVar11;
  
  uVar4 = (ulong)pPg->hdrOffset;
  puVar3 = pPg->aData;
  uVar8 = uVar4 + 1;
  uVar2 = pPg->pBt->usableSize;
  uVar6 = uVar2 - nByte;
  uVar9 = (uint)(ushort)(*(ushort *)(puVar3 + uVar4 + 1) << 8 | *(ushort *)(puVar3 + uVar4 + 1) >> 8
                        );
  while( true ) {
    if ((int)uVar6 < (int)uVar9) {
      if ((int)uVar9 <= (int)(uVar2 - 4)) {
        return (u8 *)0x0;
      }
      uVar5 = 0x10bba;
      goto LAB_001498f1;
    }
    uVar11 = *(ushort *)(puVar3 + (ulong)uVar9 + 2) << 8 |
             *(ushort *)(puVar3 + (ulong)uVar9 + 2) >> 8;
    puVar1 = (ushort *)(puVar3 + uVar9);
    uVar10 = (uint)uVar11 - nByte;
    if (-1 < (int)uVar10) break;
    uVar7 = *puVar1 << 8 | *puVar1 >> 8;
    uVar10 = uVar11 + uVar9;
    uVar8 = (ulong)uVar9;
    uVar9 = (uint)uVar7;
    if (uVar7 <= uVar10) {
      if (uVar7 != 0) {
        uVar5 = 0x10bb3;
LAB_001498f1:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar5,
                    "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
        *pRc = 0xb;
      }
      return (u8 *)0x0;
    }
  }
  if (uVar10 < 4) {
    if (0x39 < puVar3[uVar4 + 7]) {
      return (u8 *)0x0;
    }
    *(ushort *)(puVar3 + uVar8) = *puVar1;
    puVar3[uVar4 + 7] = puVar3[uVar4 + 7] + (char)uVar10;
    return (u8 *)puVar1;
  }
  if (uVar9 + uVar10 <= uVar6) {
    puVar1[1] = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
    return puVar3 + (uVar9 + uVar10);
  }
  uVar5 = 0x10ba4;
  goto LAB_001498f1;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;            /* Offset to page header */
  u8 * const aData = pPg->aData;             /* Page data */
  int iAddr = hdr + 1;                       /* Address of ptr to pc */
  u8 *pTmp = &aData[iAddr];                  /* Temporary ptr into aData[] */
  int pc = get2byte(pTmp);                   /* Address of a free slot */
  int x;                                     /* Excess size of the slot */
  int maxPC = pPg->pBt->usableSize - nByte;  /* Max address for a usable slot */
  int size;                                  /* Size of the free slot */

  assert( pc>0 );
  while( pc<=maxPC ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    pTmp = &aData[pc+2];
    size = get2byte(pTmp);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
        testcase( pc+x>maxPC );
        return &aData[pc];
      }else if( x+pc > maxPC ){
        /* This slot extends off the end of the usable part of the page */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
        ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pTmp = &aData[pc];
    pc = get2byte(pTmp);
    if( pc<=iAddr+size ){
      if( pc ){
        /* The next slot in the chain is not past the end of the current slot */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
      }
      return 0;
    }
  }
  if( pc>maxPC+nByte-4 ){
    /* The free slot chain extends off the end of the page */
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }
  return 0;
}